

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetWindowFontScale(float scale)

{
  ImGuiContext *pIVar1;
  ImGuiWindow *this;
  float fVar2;
  ImGuiWindow *window;
  ImGuiContext *g;
  float scale_local;
  
  pIVar1 = GImGui;
  if (0.0 < scale) {
    this = GetCurrentWindow();
    this->FontWindowScale = scale;
    fVar2 = ImGuiWindow::CalcFontSize(this);
    (pIVar1->DrawListSharedData).FontSize = fVar2;
    pIVar1->FontSize = fVar2;
    return;
  }
  __assert_fail("scale > 0.0f",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui.cpp"
                ,0x1cc2,"void ImGui::SetWindowFontScale(float)");
}

Assistant:

void ImGui::SetWindowFontScale(float scale)
{
    IM_ASSERT(scale > 0.0f);
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    window->FontWindowScale = scale;
    g.FontSize = g.DrawListSharedData.FontSize = window->CalcFontSize();
}